

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.cpp
# Opt level: O2

void amrex::parser_print(amrex_parser *parser)

{
  parser_node *node;
  ostream *os_;
  AllPrint printer;
  allocator local_1b9;
  string local_1b8;
  Print local_198;
  
  os_ = OutStream();
  AllPrint::AllPrint((AllPrint *)&local_198,os_);
  *(undefined8 *)(&local_198.field_0x18 + *(long *)(local_198._16_8_ + -0x18)) = 0x11;
  node = parser->ast;
  std::__cxx11::string::string((string *)&local_1b8,"  ",&local_1b9);
  parser_ast_print(node,&local_1b8,(AllPrint *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  Print::~Print(&local_198);
  return;
}

Assistant:

void
parser_print (struct amrex_parser* parser)
{
    amrex::AllPrint printer{};
    printer.SetPrecision(17);
    parser_ast_print(parser->ast, std::string("  "), printer);
}